

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddImage.c
# Opt level: O0

Extra_ImageNode_t *
Extra_CombineTwoNodes
          (DdManager *dd,DdNode *bCube,Extra_ImageNode_t *pNode1,Extra_ImageNode_t *pNode2)

{
  int iVar1;
  Extra_ImagePart_t *__s;
  DdNode *pDVar2;
  Extra_ImageNode_t *__s_00;
  Extra_ImagePart_t *pPart;
  Extra_ImageNode_t *pNode;
  Extra_ImageNode_t *pNode2_local;
  Extra_ImageNode_t *pNode1_local;
  DdNode *bCube_local;
  DdManager *dd_local;
  
  __s = (Extra_ImagePart_t *)malloc(0x18);
  memset(__s,0,0x18);
  pDVar2 = Cudd_bddAndAbstract(dd,pNode1->pPart->bFunc,pNode2->pPart->bFunc,bCube);
  __s->bFunc = pDVar2;
  Cudd_Ref(__s->bFunc);
  pDVar2 = Cudd_bddAndAbstract(dd,pNode1->pPart->bSupp,pNode2->pPart->bSupp,bCube);
  __s->bSupp = pDVar2;
  Cudd_Ref(__s->bSupp);
  iVar1 = Extra_bddSuppSize(dd,__s->bSupp);
  __s->nSupp = (short)iVar1;
  iVar1 = Cudd_DagSize(__s->bFunc);
  __s->nNodes = iVar1;
  __s->iPart = -1;
  __s_00 = (Extra_ImageNode_t *)malloc(0x30);
  memset(__s_00,0,0x30);
  __s_00->dd = dd;
  __s_00->pPart = __s;
  __s_00->pNode1 = pNode1;
  __s_00->pNode2 = pNode2;
  pDVar2 = Cudd_bddAndAbstract(dd,pNode1->bImage,pNode2->bImage,bCube);
  __s_00->bImage = pDVar2;
  Cudd_Ref(__s_00->bImage);
  if (bCube != dd->one) {
    __s_00->bCube = bCube;
    Cudd_Ref(bCube);
  }
  return __s_00;
}

Assistant:

Extra_ImageNode_t * Extra_CombineTwoNodes( DdManager * dd, DdNode * bCube,
    Extra_ImageNode_t * pNode1, Extra_ImageNode_t * pNode2 )
{
    Extra_ImageNode_t * pNode;
    Extra_ImagePart_t * pPart;

    // create a new partition
    pPart = ABC_ALLOC( Extra_ImagePart_t, 1 );
    memset( pPart, 0, sizeof(Extra_ImagePart_t) );
    // create the function
    pPart->bFunc = Cudd_bddAndAbstract( dd, pNode1->pPart->bFunc, pNode2->pPart->bFunc, bCube );
    Cudd_Ref( pPart->bFunc );
    // update the support the partition
    pPart->bSupp = Cudd_bddAndAbstract( dd, pNode1->pPart->bSupp, pNode2->pPart->bSupp, bCube );
    Cudd_Ref( pPart->bSupp );
    // update the numbers
    pPart->nSupp  = Extra_bddSuppSize( dd, pPart->bSupp );
    pPart->nNodes = Cudd_DagSize( pPart->bFunc );
    pPart->iPart = -1;
/*
ABC_PRB( dd, pNode1->pPart->bSupp );
ABC_PRB( dd, pNode2->pPart->bSupp );
ABC_PRB( dd, pPart->bSupp );
*/
    // create a new node
    pNode = ABC_ALLOC( Extra_ImageNode_t, 1 );
    memset( pNode, 0, sizeof(Extra_ImageNode_t) );
    pNode->dd     = dd;
    pNode->pPart  = pPart;
    pNode->pNode1 = pNode1;
    pNode->pNode2 = pNode2;
    // compute the image
    pNode->bImage = Cudd_bddAndAbstract( dd, pNode1->bImage, pNode2->bImage, bCube ); 
    Cudd_Ref( pNode->bImage );
    // save the cube
    if ( bCube != b1 )
    {
        pNode->bCube = bCube;   Cudd_Ref( bCube );
    }
    return pNode;
}